

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void refittest(void)

{
  undefined8 __ptr;
  int iVar1;
  double *amse;
  FILE *__stream;
  double *y;
  double *xreg;
  double *newxreg;
  sarimax_wrapper_object obj;
  long lVar2;
  size_t __size;
  size_t __size_00;
  long lVar3;
  double dStack_25f8;
  double temp [1200];
  int local_5c [2];
  int order [3];
  
  local_5c[0] = 2;
  local_5c[1] = 1;
  order[0] = 2;
  order._4_8_ = malloc(0);
  amse = (double *)malloc(0);
  temp[0x4af] = 0.0;
  __stream = fopen("../data/seriesB.txt","r");
  if (__stream != (FILE *)0x0) {
    __size = 0;
    __size_00 = 0;
    lVar2 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf \n",(long)temp + (__size_00 - 8));
      lVar2 = lVar2 + 1;
      __size_00 = __size_00 + 8;
      __size = __size + 0x10;
    }
    y = (double *)malloc(__size_00);
    xreg = (double *)malloc(__size);
    newxreg = (double *)malloc(0);
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
      y[lVar3] = temp[lVar3 + -1];
    }
    obj = sarimax_wrapper((sarimax_wrapper_object)0x0,y,(int)lVar2,local_5c,(int *)(temp + 0x4af),
                          (double *)0x0,0,1,1,(double *)0x0,0,0);
    sarimax_wrapper_summary(obj);
    __ptr = order._4_8_;
    sarimax_wrapper_predict(obj,y,xreg,0,newxreg,(double *)order._4_8_,amse);
    putchar(10);
    printf("Predicted Values : ");
    putchar(10);
    printf("Standard Errors  : ");
    putchar(10);
    sarimax_wrapper_free(obj);
    free(y);
    free((void *)__ptr);
    free(amse);
    free(xreg);
    free(newxreg);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void refittest() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	int drift,biasadj,method;
	double *xpred, *amse,*xreg,*newxreg;
	sarimax_wrapper_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 2;
	d = 1;
	q = 2;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[4] = {P,D,Q,s};


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	drift = 1;
	biasadj = 0;
	method = 0;

	//obj = sarimax_init(p, d, q, P, D, Q, s, r , N);
	obj = sarimax_wrapper(NULL,inp,N,order,seasonal,NULL,r,drift,imean,NULL,biasadj,method);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	//sarimax_setMethod(obj, 0); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	//sarimax_exec(obj, inp,xreg);
	sarimax_wrapper_summary(obj);
	/* sarimax_predict(sarimax_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse)
        inp - Input Time Series
        xreg - Exogenous Time Series
        L - L point prediction
        newxreg - Exogenous Time Series of dimension r * L where r is the number of exogenus time series and L is the length of each
        xpred - L future values
        amse - MSE for L future values
    */

	sarimax_wrapper_predict(obj, inp, xreg, L, newxreg, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	sarimax_wrapper_free(obj);
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}